

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O2

CRule * __thiscall
allocator_default<CTilesetMapper::CRule>::alloc_array
          (allocator_default<CTilesetMapper::CRule> *this,int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_> *this_00
  ;
  long lVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(int)this;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar2 = SUB168(auVar1 * ZEXT816(0x28),0);
  uVar4 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar4 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(0x28),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  puVar3 = (ulong *)operator_new__(uVar4);
  *puVar3 = uVar6;
  if ((int)this != 0) {
    this_00 = (array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
               *)(puVar3 + 4);
    lVar5 = 0;
    do {
      array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>::
      init(this_00,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,size));
      lVar5 = lVar5 + -0x28;
      this_00 = (array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
                 *)&this_00[2].list_size;
    } while (uVar6 * -0x28 - lVar5 != 0);
  }
  return (CRule *)(puVar3 + 1);
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }